

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

iterator_range<std::_Fwd_list_const_iterator<int>_> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::active_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> match_candidate,
          _Fwd_list_const_iterator<int> corpus_current,_Fwd_list_const_iterator<int> corpus_end,
          bitmask_type *hint)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  reference element;
  bool local_c1;
  bitset<32UL> local_98;
  _Base_bitset<1UL> local_90;
  _Base_bitset<1UL> local_88;
  _Base_bitset<1UL> local_80;
  _Base_bitset<1UL> local_78;
  _Base_bitset<1UL> local_70;
  bitset<32UL> local_68;
  _Base_bitset<1UL> local_60;
  _Base_bitset<1UL> local_58;
  bitmask_type *match_column;
  _Base_bitset<1UL> local_48;
  bitset<32UL> match_indicator;
  bitmask_type *hint_local;
  bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
  *this_local;
  _Fwd_list_const_iterator<int> corpus_end_local;
  _Fwd_list_const_iterator<int> corpus_current_local;
  _Fwd_list_const_iterator<int> match_candidate_local;
  
  match_indicator.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)hint;
  this_local = (bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                *)corpus_end._M_node;
  corpus_end_local = corpus_current;
  corpus_current_local = match_candidate;
  std::bitset<32UL>::bitset((bitset<32UL> *)&match_column,1);
  peVar2 = std::
           __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  sVar3 = algorithm::detail::
          element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
          ::length(peVar2);
  local_48._M_w =
       (_WordT)left_shift<std::bitset<32ul>,unsigned_long>((bitset<32UL>)match_column,sVar3 - 1);
  local_58 = match_indicator.super__Base_bitset<1UL>._M_w;
  while( true ) {
    bVar1 = std::operator!=(&corpus_end_local,(_Self *)&this_local);
    local_c1 = false;
    if (bVar1) {
      local_60._M_w = (_WordT)std::operator&(local_58._M_w,(bitset<32UL> *)&local_48);
      std::bitset<32UL>::bitset(&local_68,0);
      local_c1 = std::bitset<32UL>::operator==((bitset<32UL> *)&local_60,&local_68);
    }
    if (local_c1 == false) break;
    local_80._M_w = ((_Base_bitset<1UL> *)local_58._M_w)->_M_w;
    local_78._M_w =
         (_WordT)bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                 ::bit_shift(local_80._M_w);
    peVar2 = std::
             __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    element = std::_Fwd_list_const_iterator<int>::operator*(&corpus_end_local);
    local_88._M_w =
         (_WordT)algorithm::detail::
                 element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                 ::operator[](peVar2,element);
    local_70._M_w = (_WordT)std::operator&((bitset<32UL> *)&local_78,(bitset<32UL> *)&local_88);
    ((_Base_bitset<1UL> *)local_58._M_w)->_M_w = local_70._M_w;
    std::_Fwd_list_const_iterator<int>::operator++(&corpus_end_local);
    std::_Fwd_list_const_iterator<int>::operator++(&corpus_current_local);
  }
  local_90._M_w = (_WordT)std::operator&(local_58._M_w,(bitset<32UL> *)&local_48);
  std::bitset<32UL>::bitset(&local_98,0);
  bVar1 = std::bitset<32UL>::operator==((bitset<32UL> *)&local_90,&local_98);
  if (bVar1) {
    _match_candidate_local =
         (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          )boost::make_iterator_range<std::_Fwd_list_const_iterator<int>>
                     ((_Fwd_list_const_iterator<int>)this_local,
                      (_Fwd_list_const_iterator<int>)this_local);
  }
  else {
    _match_candidate_local =
         (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          )boost::make_iterator_range<std::_Fwd_list_const_iterator<int>>
                     (corpus_current_local,corpus_end_local);
  }
  return (iterator_range<std::_Fwd_list_const_iterator<int>_>)_match_candidate_local;
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }